

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.cpp
# Opt level: O0

void __thiscall
Nova::Grid<float,_2>::Nodes_In_Cell_From_Minimum_Corner_Node
          (Grid<float,_2> *this,T_INDEX *minimum_corner_node,T_INDEX *nodes)

{
  bool bVar1;
  long lVar2;
  Vector<int,_2,_true> local_7c [3];
  Vector<int,_2,_true> local_64;
  Vector<int,_2,_true> local_5c;
  Range<int,_2> local_54;
  undefined1 local_44 [8];
  Range_Iterator<2,_Nova::Vector<int,_2,_true>_> iterator;
  int node;
  T_INDEX *nodes_local;
  T_INDEX *minimum_corner_node_local;
  Grid<float,_2> *this_local;
  
  iterator.index._data._M_elems[0] = 0;
  unique0x1000012b = nodes;
  Vector<int,_2,_true>::Vector(&local_5c);
  Vector<int,_2,_true>::Vector(&local_64,1);
  Range<int,_2>::Range(&local_54,&local_5c,&local_64);
  Range_Iterator<2,Nova::Vector<int,2,true>>::Range_Iterator<Nova::Range<int,2>>
            ((Range_Iterator<2,Nova::Vector<int,2,true>> *)local_44,&local_54);
  while( true ) {
    bVar1 = Range_Iterator<2,_Nova::Vector<int,_2,_true>_>::Valid
                      ((Range_Iterator<2,_Nova::Vector<int,_2,_true>_> *)local_44);
    if (!bVar1) break;
    Range_Iterator<2,_Nova::Vector<int,_2,_true>_>::Index
              ((Range_Iterator<2,_Nova::Vector<int,_2,_true>_> *)local_44);
    Vector<int,_2,_true>::operator+(local_7c,minimum_corner_node);
    lVar2 = (long)iterator.index._data._M_elems[0];
    iterator.index._data._M_elems[0] = iterator.index._data._M_elems[0] + 1;
    Vector<int,_2,_true>::operator=(stack0xffffffffffffffe0 + lVar2,local_7c);
    Range_Iterator<2,_Nova::Vector<int,_2,_true>_>::Next
              ((Range_Iterator<2,_Nova::Vector<int,_2,_true>_> *)local_44);
  }
  Range_Iterator<2,_Nova::Vector<int,_2,_true>_>::~Range_Iterator
            ((Range_Iterator<2,_Nova::Vector<int,_2,_true>_> *)local_44);
  return;
}

Assistant:

void Grid<T,d>::
Nodes_In_Cell_From_Minimum_Corner_Node(const T_INDEX& minimum_corner_node,T_INDEX nodes[number_of_nodes_per_cell]) const
{
    int node=0;
    for(Range_Iterator<d> iterator(Range<int,d>(T_INDEX(),T_INDEX(1)));iterator.Valid();iterator.Next())
        nodes[node++]=minimum_corner_node+iterator.Index();
}